

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O1

void on_underlying_ws_close_complete(void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  WSIO_INSTANCE *wsio_instance;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                 ,"on_underlying_ws_close_complete",0x81,1,
                 "NULL context passed to on_underlying_ws_close_complete");
      return;
    }
  }
  else {
    *(undefined4 *)((long)context + 0x40) = 0;
    if (*(code **)((long)context + 0x30) != (code *)0x0) {
      (**(code **)((long)context + 0x30))(*(undefined8 *)((long)context + 0x38));
      return;
    }
  }
  return;
}

Assistant:

static void on_underlying_ws_close_complete(void* context)
{
    WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)context;
    if (wsio_instance == NULL)
    {
        /* Codes_SRS_WSIO_01_161: [ If the context passed to on_underlying_ws_close_complete is NULL, on_underlying_ws_close_complete shall do nothing. ]*/
        LogError("NULL context passed to on_underlying_ws_close_complete");
    }
    else
    {
        wsio_instance->io_state = IO_STATE_NOT_OPEN;

        /* Codes_SRS_WSIO_01_160: [ If NULL was passed to wsio_close no callback shall be called. ]*/
        if (wsio_instance->on_io_close_complete != NULL)
        {
            /* Codes_SRS_WSIO_01_159: [ When on_underlying_ws_close_complete while the IO is closing (after wsio_close), the close shall be indicated up by calling the on_io_close_complete callback passed to wsio_close. ]*/
            /* Codes_SRS_WSIO_01_163: [ When on_io_close_complete is called, the context passed to wsio_close shall be passed as argument to on_io_close_complete. ]*/
            wsio_instance->on_io_close_complete(wsio_instance->on_io_close_complete_context);
        }
    }
}